

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int ffgacl(fitsfile *fptr,int colnum,char *ttype,long *tbcol,char *tunit,char *tform,double *tscal,
          double *tzero,char *tnull,char *tdisp,int *status)

{
  tcolumn *ptVar1;
  int iVar2;
  char name [75];
  int local_dc;
  char local_d8 [80];
  char local_88 [88];
  
  iVar2 = *status;
  if (iVar2 < 1) {
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar2 = ffrdef(fptr,status), 0 < iVar2)) {
        return *status;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if ((colnum < 1) || (fptr->Fptr->tfield < colnum)) {
      *status = 0x12e;
      iVar2 = 0x12e;
    }
    else {
      ptVar1 = fptr->Fptr->tableptr;
      if (ttype != (char *)0x0) {
        strcpy(ttype,ptVar1[(ulong)(uint)colnum - 1].ttype);
      }
      if (tbcol != (long *)0x0) {
        *tbcol = ptVar1[(ulong)(uint)colnum - 1].tbcol + 1;
      }
      if (tform != (char *)0x0) {
        strcpy(tform,ptVar1[(ulong)(uint)colnum - 1].tform);
      }
      if (tscal != (double *)0x0) {
        *tscal = ptVar1[(ulong)(uint)colnum - 1].tscale;
      }
      if (tzero != (double *)0x0) {
        *tzero = ptVar1[(ulong)(uint)colnum - 1].tzero;
      }
      if (tnull != (char *)0x0) {
        strcpy(tnull,ptVar1[(ulong)(uint)colnum - 1].strnull);
      }
      if (tunit != (char *)0x0) {
        ffkeyn("TUNIT",colnum,local_88,status);
        local_dc = 0;
        *tunit = '\0';
        ffgkys(fptr,local_88,tunit,local_d8,&local_dc);
      }
      if (tdisp != (char *)0x0) {
        ffkeyn("TDISP",colnum,local_88,status);
        local_dc = 0;
        *tdisp = '\0';
        ffgkys(fptr,local_88,tdisp,local_d8,&local_dc);
      }
      iVar2 = *status;
    }
  }
  return iVar2;
}

Assistant:

int ffgacl( fitsfile *fptr,   /* I - FITS file pointer                      */
            int  colnum,      /* I - column number                          */
            char *ttype,      /* O - TTYPEn keyword value                   */
            long *tbcol,      /* O - TBCOLn keyword value                   */
            char *tunit,      /* O - TUNITn keyword value                   */
            char *tform,      /* O - TFORMn keyword value                   */
            double *tscal,    /* O - TSCALn keyword value                   */
            double *tzero,    /* O - TZEROn keyword value                   */
            char *tnull,      /* O - TNULLn keyword value                   */
            char *tdisp,      /* O - TDISPn keyword value                   */
            int  *status)     /* IO - error status                          */
/*
  get ASCII column keyword values
*/
{
    char name[FLEN_KEYWORD], comm[FLEN_COMMENT];
    tcolumn *colptr;
    int tstatus;

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               /* rescan header */
            return(*status);

    if (colnum < 1 || colnum > (fptr->Fptr)->tfield)
        return(*status = BAD_COL_NUM);

    /* get what we can from the column structure */

    colptr = (fptr->Fptr)->tableptr;   /* pointer to first column */
    colptr += (colnum -1);     /* offset to correct column */

    if (ttype)
        strcpy(ttype, colptr->ttype);

    if (tbcol)
        *tbcol = (long) ((colptr->tbcol) + 1);  /* first col is 1, not 0 */

    if (tform)
        strcpy(tform, colptr->tform);

    if (tscal)
        *tscal = colptr->tscale;

    if (tzero)
        *tzero = colptr->tzero;

    if (tnull)
        strcpy(tnull, colptr->strnull);

    /* read keywords to get additional parameters */

    if (tunit)
    {
        ffkeyn("TUNIT", colnum, name, status);
        tstatus = 0;
        *tunit = '\0';
        ffgkys(fptr, name, tunit, comm, &tstatus);
    }

    if (tdisp)
    {
        ffkeyn("TDISP", colnum, name, status);
        tstatus = 0;
        *tdisp = '\0';
        ffgkys(fptr, name, tdisp, comm, &tstatus);
    }

    return(*status);
}